

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O3

qpdf_oh qpdf_make_indirect_object(qpdf_data qpdf,qpdf_oh oh)

{
  uint uVar1;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<unsigned_int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:877:12)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<unsigned_int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:877:12)>
             ::_M_manager;
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<unsigned_int_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:1582:70)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<unsigned_int_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:1582:70)>
             ::_M_manager;
  local_48._M_unused._M_object = qpdf;
  local_28._M_unused._M_object = qpdf;
  uVar1 = do_with_oh<unsigned_int>
                    (qpdf,oh,(function<unsigned_int_()> *)&local_28,
                     (function<unsigned_int_(QPDFObjectHandle_&)> *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return uVar1;
}

Assistant:

qpdf_oh
qpdf_make_indirect_object(qpdf_data qpdf, qpdf_oh oh)
{
    return do_with_oh<qpdf_oh>(qpdf, oh, return_uninitialized(qpdf), [qpdf](QPDFObjectHandle& o) {
        return new_object(qpdf, qpdf->qpdf->makeIndirectObject(o));
    });
}